

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MP1Node.cpp
# Opt level: O2

void __thiscall MP1Node::nodeLoopOps(MP1Node *this)

{
  Member *pMVar1;
  short sVar2;
  int iVar3;
  ostream *poVar4;
  int iVar5;
  MP1Node *this_00;
  MP1Node *pMVar6;
  pointer pMVar7;
  Address toAddr;
  undefined1 local_68 [64];
  
  poVar4 = std::operator<<((ostream *)&std::cout,"start nodeLoopOps...");
  std::endl<char,std::char_traits<char>>(poVar4);
  iVar3 = Params::getcurrtime(this->par);
  if ((3 < iVar3) &&
     (pMVar1 = this->memberNode,
     1 < (ulong)(((long)(pMVar1->memberList).
                        super__Vector_base<MemberListEntry,_std::allocator<MemberListEntry>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pMVar1->memberList).
                       super__Vector_base<MemberListEntry,_std::allocator<MemberListEntry>_>._M_impl
                       .super__Vector_impl_data._M_start) / 0x18))) {
    pMVar6 = (MP1Node *)(local_68 + 0x20);
    this_00 = pMVar6;
    Address::getAddress_abi_cxx11_((string *)pMVar6,&pMVar1->addr);
    iVar3 = getIdFromAddress(this_00,(string *)pMVar6);
    std::__cxx11::string::~string((string *)(local_68 + 0x20));
    pMVar6 = (MP1Node *)local_68;
    Address::getAddress_abi_cxx11_((string *)local_68,&this->memberNode->addr);
    sVar2 = getPortFromAddress(pMVar6,(string *)local_68);
    std::__cxx11::string::~string((string *)local_68);
    for (pMVar7 = (this->memberNode->memberList).
                  super__Vector_base<MemberListEntry,_std::allocator<MemberListEntry>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pMVar7 != (this->memberNode->memberList).
                  super__Vector_base<MemberListEntry,_std::allocator<MemberListEntry>_>._M_impl.
                  super__Vector_impl_data._M_finish; pMVar7 = pMVar7 + 1) {
      if ((pMVar7->id == iVar3) && (pMVar7->port == sVar2)) {
        iVar3 = Params::getcurrtime(this->par);
        MemberListEntry::settimestamp(pMVar7,(long)iVar3);
        pMVar7->heartbeat = pMVar7->heartbeat + 1;
        break;
      }
    }
    iVar3 = rand();
    pMVar7 = (this->memberNode->memberList).
             super__Vector_base<MemberListEntry,_std::allocator<MemberListEntry>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar5 = (int)((ulong)(long)iVar3 %
                 (((long)(this->memberNode->memberList).
                         super__Vector_base<MemberListEntry,_std::allocator<MemberListEntry>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)pMVar7) / 0x18 - 1U)) + 1
    ;
    iVar3 = Params::getcurrtime(this->par);
    if (5 < (long)iVar3 - pMVar7[iVar5].timestamp) {
      return;
    }
    toAddr.addr._0_4_ = pMVar7[iVar5].id;
    toAddr.addr._4_2_ = pMVar7[iVar5].port;
    sendMembershipList(this,&toAddr,HEARTBEATREQ);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"...end nodeLoopOps.");
  std::endl<char,std::char_traits<char>>(poVar4);
  return;
}

Assistant:

void MP1Node::nodeLoopOps() {
    cout << "start nodeLoopOps..." << endl;

    //completess and accuracy tests fail when this executed of par->getcurrtime() <= 3
    if (par->getcurrtime() > 3 && memberNode->memberList.size() > 1) {

        //update own node's heartbeat and timestamp
        int id = getIdFromAddress(memberNode->addr.getAddress());
        short port = getPortFromAddress(memberNode->addr.getAddress());
        for (vector<MemberListEntry>::iterator entry = memberNode->memberList.begin();
             entry != memberNode->memberList.end(); entry++) {
            if (entry->id == id && entry->port == port) {
                entry->settimestamp(par->getcurrtime());
                entry->heartbeat = entry->heartbeat + 1;
                break;
            }
        }

        //GOSSIP PROTOCOL: pick a random member to send the member list to
        int randomIndex = rand() % (memberNode->memberList.size() - 1) + 1;
        MemberListEntry &entry = memberNode->memberList[randomIndex];

        //check if that node has failed before sending member list to it
        if (par->getcurrtime() - entry.timestamp > TFAIL) {
            return;
        }

        //send member list
        Address toAddr;
        memcpy(&toAddr.addr[0], &entry.id, sizeof(int));
        memcpy(&toAddr.addr[4], &entry.port, sizeof(short));
        this->sendMembershipList(&toAddr, HEARTBEATREQ);
    }

    cout << "...end nodeLoopOps." << endl;
    return;
}